

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

bool __thiscall leveldb::DBImpl::GetProperty(DBImpl *this,Slice *property,string *value)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  long lVar7;
  bool local_273;
  char local_258 [8];
  char buf_2 [50];
  long local_218;
  size_t total_usage;
  undefined1 local_200 [48];
  uint local_1d0;
  uint local_1cc;
  int files;
  int level_1;
  char buf_1 [200];
  Slice local_f8;
  char local_e8 [8];
  char buf [100];
  undefined4 uStack_7c;
  bool ok;
  uint64_t level;
  undefined4 local_68;
  undefined1 local_58 [8];
  Slice prefix;
  Slice in;
  MutexLock local_30;
  MutexLock l;
  string *value_local;
  Slice *property_local;
  DBImpl *this_local;
  
  l.mu_ = (Mutex *)value;
  std::__cxx11::string::clear();
  MutexLock::MutexLock(&local_30,&this->mutex_);
  prefix.size_ = (size_t)property->data_;
  Slice::Slice((Slice *)local_58,"leveldb.");
  bVar1 = Slice::starts_with((Slice *)&prefix.size_,(Slice *)local_58);
  if (bVar1) {
    sVar5 = Slice::size((Slice *)local_58);
    Slice::remove_prefix((Slice *)&prefix.size_,sVar5);
    Slice::Slice((Slice *)&level,"num-files-at-level");
    bVar1 = Slice::starts_with((Slice *)&prefix.size_,(Slice *)&level);
    if (bVar1) {
      Slice::remove_prefix((Slice *)&prefix.size_,0x12);
      bVar1 = ConsumeDecimalNumber((Slice *)&prefix.size_,(uint64_t *)(buf + 0x60));
      local_273 = false;
      if (bVar1) {
        local_273 = Slice::empty((Slice *)&prefix.size_);
      }
      buf[0x5f] = local_273;
      if ((local_273 == false) || (6 < CONCAT44(uStack_7c,buf._96_4_))) {
        this_local._7_1_ = false;
      }
      else {
        uVar2 = VersionSet::NumLevelFiles(this->versions_,buf._96_4_);
        snprintf(local_e8,100,"%d",(ulong)uVar2);
        std::__cxx11::string::operator=((string *)l.mu_,local_e8);
        this_local._7_1_ = true;
      }
    }
    else {
      Slice::Slice(&local_f8,"stats");
      bVar1 = operator==((Slice *)&prefix.size_,&local_f8);
      if (bVar1) {
        snprintf((char *)&files,200,
                 "                               Compactions\nLevel  Files Size(MB) Time(sec) Read(MB) Write(MB)\n--------------------------------------------------\n"
                );
        std::__cxx11::string::append((char *)l.mu_);
        for (local_1cc = 0; (int)local_1cc < 7; local_1cc = local_1cc + 1) {
          uVar3 = VersionSet::NumLevelFiles(this->versions_,local_1cc);
          uVar2 = local_1cc;
          local_1d0 = uVar3;
          if ((0 < this->stats_[(int)local_1cc].micros) || (0 < (int)uVar3)) {
            iVar6 = VersionSet::NumLevelBytes(this->versions_,local_1cc);
            lVar7 = (long)(int)local_1cc;
            snprintf((char *)&files,200,"%3d %8d %8.0f %9.0f %8.0f %9.0f\n",
                     SUB84((double)iVar6 * 9.5367431640625e-07,0),
                     (double)this->stats_[lVar7].micros / 1000000.0,
                     (double)this->stats_[lVar7].bytes_read * 9.5367431640625e-07,
                     (double)this->stats_[lVar7].bytes_written * 9.5367431640625e-07,(ulong)uVar2,
                     (ulong)uVar3);
            std::__cxx11::string::append((char *)l.mu_);
          }
        }
        this_local._7_1_ = true;
      }
      else {
        Slice::Slice((Slice *)(local_200 + 0x20),"sstables");
        bVar1 = operator==((Slice *)&prefix.size_,(Slice *)(local_200 + 0x20));
        if (bVar1) {
          VersionSet::current(this->versions_);
          Version::DebugString_abi_cxx11_((Version *)local_200);
          std::__cxx11::string::operator=((string *)l.mu_,(string *)local_200);
          std::__cxx11::string::~string((string *)local_200);
          this_local._7_1_ = true;
        }
        else {
          Slice::Slice((Slice *)&total_usage,"approximate-memory-usage");
          bVar1 = operator==((Slice *)&prefix.size_,(Slice *)&total_usage);
          if (bVar1) {
            iVar4 = (*((this->options_).block_cache)->_vptr_Cache[9])();
            local_218 = CONCAT44(extraout_var,iVar4);
            if (this->mem_ != (MemTable *)0x0) {
              sVar5 = MemTable::ApproximateMemoryUsage(this->mem_);
              local_218 = sVar5 + local_218;
            }
            if (this->imm_ != (MemTable *)0x0) {
              sVar5 = MemTable::ApproximateMemoryUsage(this->imm_);
              local_218 = sVar5 + local_218;
            }
            snprintf(local_258,0x32,"%llu",local_218);
            std::__cxx11::string::append((char *)l.mu_);
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  local_68 = 1;
  MutexLock::~MutexLock(&local_30);
  return this_local._7_1_;
}

Assistant:

bool DBImpl::GetProperty(const Slice& property, std::string* value) {
  value->clear();

  MutexLock l(&mutex_);
  Slice in = property;
  Slice prefix("leveldb.");
  if (!in.starts_with(prefix)) return false;
  in.remove_prefix(prefix.size());

  if (in.starts_with("num-files-at-level")) {
    in.remove_prefix(strlen("num-files-at-level"));
    uint64_t level;
    bool ok = ConsumeDecimalNumber(&in, &level) && in.empty();
    if (!ok || level >= config::kNumLevels) {
      return false;
    } else {
      char buf[100];
      snprintf(buf, sizeof(buf), "%d",
               versions_->NumLevelFiles(static_cast<int>(level)));
      *value = buf;
      return true;
    }
  } else if (in == "stats") {
    char buf[200];
    snprintf(buf, sizeof(buf),
             "                               Compactions\n"
             "Level  Files Size(MB) Time(sec) Read(MB) Write(MB)\n"
             "--------------------------------------------------\n");
    value->append(buf);
    for (int level = 0; level < config::kNumLevels; level++) {
      int files = versions_->NumLevelFiles(level);
      if (stats_[level].micros > 0 || files > 0) {
        snprintf(buf, sizeof(buf), "%3d %8d %8.0f %9.0f %8.0f %9.0f\n", level,
                 files, versions_->NumLevelBytes(level) / 1048576.0,
                 stats_[level].micros / 1e6,
                 stats_[level].bytes_read / 1048576.0,
                 stats_[level].bytes_written / 1048576.0);
        value->append(buf);
      }
    }
    return true;
  } else if (in == "sstables") {
    *value = versions_->current()->DebugString();
    return true;
  } else if (in == "approximate-memory-usage") {
    size_t total_usage = options_.block_cache->TotalCharge();
    if (mem_) {
      total_usage += mem_->ApproximateMemoryUsage();
    }
    if (imm_) {
      total_usage += imm_->ApproximateMemoryUsage();
    }
    char buf[50];
    snprintf(buf, sizeof(buf), "%llu",
             static_cast<unsigned long long>(total_usage));
    value->append(buf);
    return true;
  }

  return false;
}